

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

int run_test_tcp_close_reset_accepted_after_shutdown(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  uv_tcp_t *in_RSI;
  char *pcVar4;
  
  loop = uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 1;
  do_connect(loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called == 0) {
      if (shutdown_cb_called == 0) {
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          if (write_cb_called == 4) {
            if (close_cb_called == 0) {
              if (shutdown_cb_called == 1) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0x120;
              }
              else {
                pcVar4 = "shutdown_cb_called == 1";
                uVar3 = 0x11e;
              }
            }
            else {
              pcVar4 = "close_cb_called == 0";
              uVar3 = 0x11d;
            }
          }
          else {
            pcVar4 = "write_cb_called == 4";
            uVar3 = 0x11c;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x11a;
        }
      }
      else {
        pcVar4 = "shutdown_cb_called == 0";
        uVar3 = 0x117;
      }
    }
    else {
      pcVar4 = "close_cb_called == 0";
      uVar3 = 0x116;
    }
  }
  else {
    pcVar4 = "write_cb_called == 0";
    uVar3 = 0x115;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted_after_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 1;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}